

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Structure * __thiscall soul::AST::StructDeclaration::getStruct(StructDeclaration *this)

{
  StructurePtr *this_00;
  Structure *pSVar1;
  string *psVar2;
  Member *pMVar3;
  long lVar4;
  Type TStack_88;
  string local_70;
  string local_50;
  
  this_00 = &this->structure;
  if ((this->structure).object == (Structure *)0x0) {
    pSVar1 = (Structure *)operator_new(0x288);
    psVar2 = Identifier::toString_abi_cxx11_(&(this->super_TypeDeclarationBase).name);
    std::__cxx11::string::string((string *)&local_70,(string *)psVar2);
    Structure::Structure(pSVar1,&local_70,this);
    RefCountedPtr<soul::Structure>::reset(this_00,pSVar1);
    std::__cxx11::string::~string((string *)&local_70);
    pMVar3 = (this->members).items;
    for (lVar4 = (this->members).numActive * 0x28; lVar4 != 0; lVar4 = lVar4 + -0x28) {
      pSVar1 = RefCountedPtr<soul::Structure>::operator->(this_00);
      (*(((pMVar3->type).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&TStack_88);
      psVar2 = Identifier::toString_abi_cxx11_(&pMVar3->name);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
      Structure::addMember(pSVar1,&TStack_88,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_88.structure);
      pMVar3 = pMVar3 + 1;
    }
  }
  pSVar1 = RefCountedPtr<soul::Structure>::operator*(this_00);
  return pSVar1;
}

Assistant:

Structure& getStruct() const
        {
            if (structure == nullptr)
            {
                structure.reset (new Structure (name.toString(), const_cast<StructDeclaration*> (this)));

                for (auto& m : members)
                    structure->addMember (m.type->resolveAsType(), m.name.toString());
            }

            return *structure;
        }